

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O3

void __thiscall MetaDCEGraph::MetaDCEGraph(MetaDCEGraph *this,Module *wasm)

{
  long *plVar1;
  long lVar2;
  undefined4 local_150 [2];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38 [5];
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  (this->nodes)._M_h._M_buckets = &(this->nodes)._M_h._M_single_bucket;
  (this->nodes)._M_h._M_bucket_count = 1;
  (this->nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes)._M_h._M_element_count = 0;
  (this->nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->roots)._M_h._M_buckets = &(this->roots)._M_h._M_single_bucket;
  (this->roots)._M_h._M_bucket_count = 1;
  (this->roots)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->roots)._M_h._M_element_count = 0;
  (this->roots)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->roots)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->roots)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->exportToDCENode)._M_h._M_buckets = &(this->exportToDCENode)._M_h._M_single_bucket;
  (this->exportToDCENode)._M_h._M_bucket_count = 1;
  (this->exportToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exportToDCENode)._M_h._M_element_count = 0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exportToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itemToDCENode)._M_h._M_buckets = &(this->itemToDCENode)._M_h._M_single_bucket;
  (this->itemToDCENode)._M_h._M_bucket_count = 1;
  (this->itemToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itemToDCENode)._M_h._M_element_count = 0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itemToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importIdToDCENode)._M_h._M_buckets = &(this->importIdToDCENode)._M_h._M_single_bucket;
  (this->importIdToDCENode)._M_h._M_bucket_count = 1;
  (this->importIdToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importIdToDCENode)._M_h._M_element_count = 0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importIdToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->wasm = wasm;
  local_150[0] = 0;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"func","");
  local_128 = 1;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"table","");
  local_100 = 2;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"memory","");
  local_d8 = 3;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"global","");
  local_b0 = 4;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"tag","");
  local_88 = 5;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"dseg","");
  local_60 = 6;
  plVar1 = local_48;
  local_58[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"eseg","");
  std::
  _Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>const*>
            ((_Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->kindPrefixes,local_150,local_38,0,&local_33,&local_32,&local_31);
  lVar2 = -0x118;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->nameIndex = 0;
  (this->reached)._M_h._M_buckets = &(this->reached)._M_h._M_single_bucket;
  (this->reached)._M_h._M_bucket_count = 1;
  (this->reached)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reached)._M_h._M_element_count = 0;
  (this->reached)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reached)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reached)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MetaDCEGraph(Module& wasm) : wasm(wasm) {}